

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

Integer pnga_pgroup_duplicate(Integer grp)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  void *__ptr;
  long in_RDI;
  int parent;
  Integer save_grp;
  ARMCI_Group *tmpgrp;
  int *tmp2_list;
  int *tmp_list;
  int tmp_count;
  Integer itmp;
  Integer nprocs;
  Integer j;
  Integer i;
  Integer pgrp_handle;
  Integer in_stack_00000138;
  char *in_stack_00000140;
  int *in_stack_ffffffffffffff98;
  bool local_5d;
  int in_stack_ffffffffffffffa4;
  int n;
  long local_18;
  long local_10;
  
  if ((in_RDI != -1) && (PGRP_LIST[in_RDI].actv == 0)) {
    pnga_error(in_stack_00000140,in_stack_00000138);
  }
  local_10 = -1;
  local_18 = 0;
  do {
    if (PGRP_LIST[local_18].actv == 0) {
      local_10 = local_18;
    }
    local_18 = local_18 + 1;
    local_5d = local_18 < _max_global_array && local_10 == -1;
  } while (local_5d);
  if (local_10 == -1) {
    pnga_error(in_stack_00000140,in_stack_00000138);
  }
  piVar3 = (int *)malloc(GAnproc << 3);
  PGRP_LIST[local_10].map_proc_list = piVar3;
  PGRP_LIST[local_10].inv_map_proc_list = PGRP_LIST[local_10].map_proc_list + GAnproc;
  for (local_18 = 0; local_18 < GAnproc; local_18 = local_18 + 1) {
    PGRP_LIST[local_10].map_proc_list[local_18] = -1;
  }
  for (local_18 = 0; local_18 < GAnproc; local_18 = local_18 + 1) {
    PGRP_LIST[local_10].inv_map_proc_list[local_18] = -1;
  }
  if (in_RDI == -1) {
    for (local_18 = 0; local_18 < GAnproc; local_18 = local_18 + 1) {
      PGRP_LIST[local_10].map_proc_list[local_18] = (int)local_18;
      PGRP_LIST[local_10].inv_map_proc_list[local_18] = (int)local_18;
    }
  }
  else {
    for (local_18 = 0; local_18 < GAnproc; local_18 = local_18 + 1) {
      PGRP_LIST[local_10].map_proc_list[local_18] = PGRP_LIST[in_RDI].map_proc_list[local_18];
      PGRP_LIST[local_10].inv_map_proc_list[local_18] =
           PGRP_LIST[in_RDI].inv_map_proc_list[local_18];
    }
  }
  iVar1 = PGRP_LIST[in_RDI].map_nproc;
  __ptr = malloc(GAnproc << 2);
  iVar2 = GA_Default_Proc_Group;
  piVar3 = PGRP_LIST[in_RDI].inv_map_proc_list;
  n = PGRP_LIST[in_RDI].parent;
  GA_Default_Proc_Group = n;
  if ((in_RDI == -1) || (n == -1)) {
    if ((in_RDI == -1) || (n != -1)) {
      for (local_18 = 0; n = in_stack_ffffffffffffffa4, local_18 < GAnproc; local_18 = local_18 + 1)
      {
        *(int *)((long)__ptr + local_18 * 4) = (int)local_18;
      }
    }
    else {
      for (local_18 = 0; n = in_stack_ffffffffffffffa4, local_18 < iVar1; local_18 = local_18 + 1) {
        *(int *)((long)__ptr + local_18 * 4) = PGRP_LIST[in_RDI].map_proc_list[piVar3[local_18]];
      }
    }
  }
  else {
    for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
      *(int *)((long)__ptr + local_18 * 4) = PGRP_LIST[n].map_proc_list[piVar3[local_18]];
    }
  }
  PGRP_LIST[local_10].map_nproc = iVar1;
  PGRP_LIST[local_10].actv = 1;
  PGRP_LIST[local_10].parent = PGRP_LIST[in_RDI].parent;
  PGRP_LIST[local_10].mirrored = 0;
  PGRP_LIST[local_10].map_nproc = PGRP_LIST[in_RDI].map_nproc;
  ARMCI_Group_create(n,in_stack_ffffffffffffff98,(ARMCI_Group *)0x1bfbd4);
  GA_Default_Proc_Group = iVar2;
  free(__ptr);
  return local_10;
}

Assistant:

Integer pnga_pgroup_duplicate(Integer grp)
{
    Integer pgrp_handle, i, j, nprocs, itmp;
    int tmp_count;
    int *tmp_list, *tmp2_list;
#ifdef MSG_COMMS_MPI
    ARMCI_Group *tmpgrp;
#endif
    Integer save_grp;
    if (grp != -1 && !PGRP_LIST[grp].actv) {
       pnga_error(" Group is not active ", grp);
    }

    /*** Get next free process group handle ***/
    pgrp_handle =-1; i=0;
    do{
       if(!PGRP_LIST[i].actv) pgrp_handle=i;
       i++;
    }while(i<_max_global_array && pgrp_handle==-1);
    if( pgrp_handle == -1)
       pnga_error(" Too many process groups ", (Integer)_max_global_array);
 
    /* Allocate memory for arrays containg processor maps and initialize
       values */
    PGRP_LIST[pgrp_handle].map_proc_list
       = (int*)malloc(GAnproc*sizeof(int)*2);
    PGRP_LIST[pgrp_handle].inv_map_proc_list
       = PGRP_LIST[pgrp_handle].map_proc_list + GAnproc;
    for (i=0; i<GAnproc; i++)
       PGRP_LIST[pgrp_handle].map_proc_list[i] = -1;
    for (i=0; i<GAnproc; i++)
       PGRP_LIST[pgrp_handle].inv_map_proc_list[i] = -1;
    if (grp != -1) {
      for (i=0; i<GAnproc; i++) {
        PGRP_LIST[pgrp_handle].map_proc_list[i]
          = PGRP_LIST[grp].map_proc_list[i];
        PGRP_LIST[pgrp_handle].inv_map_proc_list[i]
          = PGRP_LIST[grp].inv_map_proc_list[i];
      }
    } else {
      for (i=0; i<GAnproc; i++) {
        PGRP_LIST[pgrp_handle].map_proc_list[i]
          = i;
        PGRP_LIST[pgrp_handle].inv_map_proc_list[i]
          = i;
      }
    }
    tmp_count = PGRP_LIST[grp].map_nproc;

    tmp_list = (int*)malloc(GAnproc*sizeof(int));
    tmp2_list = PGRP_LIST[grp].inv_map_proc_list;
    save_grp = GA_Default_Proc_Group;
    GA_Default_Proc_Group = PGRP_LIST[grp].parent;
    if (grp != -1 && GA_Default_Proc_Group != -1) {
       int parent = GA_Default_Proc_Group;
       for (i=0; i<tmp_count; i++) {
          tmp_list[i] = (int)PGRP_LIST[parent].map_proc_list[tmp2_list[i]];
       }
    } else if (grp != -1 && GA_Default_Proc_Group == -1) {
       for (i=0; i<tmp_count; i++) {
          tmp_list[i] = (int)PGRP_LIST[grp].map_proc_list[tmp2_list[i]];
       }
    } else {
       for (i=0; i<GAnproc; i++) {
          tmp_list[i] = i;
       }
    }
    
    PGRP_LIST[pgrp_handle].map_nproc = tmp_count;
    PGRP_LIST[pgrp_handle].actv = 1;
    PGRP_LIST[pgrp_handle].parent = PGRP_LIST[grp].parent;
    PGRP_LIST[pgrp_handle].mirrored = 0;
    PGRP_LIST[pgrp_handle].map_nproc = PGRP_LIST[grp].map_nproc;
#ifdef MSG_COMMS_MPI
    tmpgrp = &PGRP_LIST[pgrp_handle].group;
#if ENABLE_CHECKPOINT
    if(ga_group_is_for_ft)
       tmpgrp = ARMCI_Get_ft_group();
    else
#endif
       ARMCI_Group_create(tmp_count, tmp_list, &PGRP_LIST[pgrp_handle].group);
#endif

    GA_Default_Proc_Group = save_grp;
    /* Clean up temporary arrays */
    free(tmp_list);

#ifdef MSG_COMMS_MPI
    return pgrp_handle;
#else
    return pnga_pgroup_get_default();
#endif
}